

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_plot(nk_context *ctx,nk_chart_type type,float *values,int count,int offset)

{
  int iVar1;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float max_value;
  float min_value;
  int i;
  int offset_local;
  int count_local;
  float *values_local;
  nk_chart_type type_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5eea,
                  "void nk_plot(struct nk_context *, enum nk_chart_type, const float *, int, int)");
  }
  if (values == (float *)0x0) {
    __assert_fail("values",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5eeb,
                  "void nk_plot(struct nk_context *, enum nk_chart_type, const float *, int, int)");
  }
  if (((ctx != (nk_context *)0x0) && (values != (float *)0x0)) && (count != 0)) {
    local_30 = values[offset];
    local_34 = values[offset];
    for (max_value = 0.0; (int)max_value < count; max_value = (float)((int)max_value + 1)) {
      if (local_30 <= values[(int)max_value + offset]) {
        local_38 = local_30;
      }
      else {
        local_38 = values[(int)max_value + offset];
      }
      local_30 = local_38;
      if (local_34 <= values[(int)max_value + offset]) {
        local_3c = values[(int)max_value + offset];
      }
      else {
        local_3c = local_34;
      }
      local_34 = local_3c;
    }
    iVar1 = nk_chart_begin(ctx,type,count,local_30,local_34);
    if (iVar1 != 0) {
      for (max_value = 0.0; (int)max_value < count; max_value = (float)((int)max_value + 1)) {
        nk_chart_push(ctx,values[(int)max_value + offset]);
      }
      nk_chart_end(ctx);
    }
  }
  return;
}

Assistant:

NK_API void
nk_plot(struct nk_context *ctx, enum nk_chart_type type, const float *values,
    int count, int offset)
{
    int i = 0;
    float min_value;
    float max_value;

    NK_ASSERT(ctx);
    NK_ASSERT(values);
    if (!ctx || !values || !count) return;

    min_value = values[offset];
    max_value = values[offset];
    for (i = 0; i < count; ++i) {
        min_value = NK_MIN(values[i + offset], min_value);
        max_value = NK_MAX(values[i + offset], max_value);
    }

    if (nk_chart_begin(ctx, type, count, min_value, max_value)) {
        for (i = 0; i < count; ++i)
            nk_chart_push(ctx, values[i + offset]);
        nk_chart_end(ctx);
    }
}